

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O1

Am_Edit_Translation_Table Am_Edit_Translation_Table::Default_Table(void)

{
  _func_int **pp_Var1;
  Am_Edit_Translation_Table_Data *in_RDI;
  Am_Input_Char local_68;
  Am_Input_Char local_64;
  Am_Input_Char local_60;
  Am_Input_Char local_5c;
  Am_Input_Char local_58;
  Am_Input_Char local_54;
  Am_Input_Char local_50;
  Am_Input_Char local_4c;
  Am_Input_Char local_48;
  Am_Input_Char local_44;
  Am_Input_Char local_40;
  Am_Input_Char local_3c;
  Am_Input_Char local_38;
  Am_Input_Char local_34;
  Am_Input_Char local_30;
  Am_Input_Char local_2c;
  Am_Input_Char local_28;
  Am_Input_Char local_24;
  Am_Input_Char local_20;
  Am_Input_Char local_1c;
  
  Am_Edit_Translation_Table((Am_Edit_Translation_Table *)in_RDI);
  Am_Input_Char::Am_Input_Char(&local_1c,"RIGHT_ARROW",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_1c,Am_Move_Cursor_Right);
  Am_Input_Char::Am_Input_Char(&local_20,"LEFT_ARROW",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_20,Am_Move_Cursor_Left);
  Am_Input_Char::Am_Input_Char(&local_24,"CONTROL_f",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_24,Am_Move_Cursor_Right);
  Am_Input_Char::Am_Input_Char(&local_28,"CONTROL_b",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_28,Am_Move_Cursor_Left);
  Am_Input_Char::Am_Input_Char(&local_2c,"CONTROL_a",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_2c,Am_Move_Cursor_To_Start);
  Am_Input_Char::Am_Input_Char(&local_30,"HOME",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_30,Am_Move_Cursor_To_Start);
  Am_Input_Char::Am_Input_Char(&local_34,"CONTROL_e",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_34,Am_Move_Cursor_To_End)
  ;
  Am_Input_Char::Am_Input_Char(&local_38,"END",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_38,Am_Move_Cursor_To_End)
  ;
  Am_Input_Char::Am_Input_Char(&local_3c,"CONTROL_h",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_3c,Am_Delete_Char_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_40,"BACKSPACE",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_40,Am_Delete_Char_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_44,"CONTROL_d",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_44,Am_Delete_Char_After_Cursor);
  Am_Input_Char::Am_Input_Char(&local_48,"CONTROL_k",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt((Am_Map_in_char2text_op *)pp_Var1[2],local_48,Am_Kill_From_Cursor);
  Am_Input_Char::Am_Input_Char(&local_4c,"CONTROL_u",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_4c,Am_Delete_Entire_String);
  Am_Input_Char::Am_Input_Char(&local_50,"CONTROL_w",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_50,Am_Delete_Word_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_54,"CONTROL_BACKSPACE",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_54,Am_Delete_Word_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_58,"CONTROL_c",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_58,Am_Set_Cut_Buffer_From_Text);
  Am_Input_Char::Am_Input_Char(&local_5c,"MIDDLE_DOWN",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_5c,Am_Insert_Cut_Buffer_At_Cursor);
  Am_Input_Char::Am_Input_Char(&local_60,"DELETE",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_60,Am_Delete_Char_Before_Cursor);
  Am_Input_Char::Am_Input_Char(&local_64,"CONTROL_DELETE",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_64,Am_Delete_Word_After_Cursor);
  Am_Input_Char::Am_Input_Char(&local_68,"CONTROL_y",true);
  pp_Var1 = (_func_int **)
            (**(code **)(*(in_RDI->super_Am_Wrapper).super_Am_Registered_Type.
                          _vptr_Am_Registered_Type + 0x28))();
  (in_RDI->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type = pp_Var1;
  Am_Map_in_char2text_op::SetAt
            ((Am_Map_in_char2text_op *)pp_Var1[2],local_68,Am_Insert_Cut_Buffer_At_Cursor);
  return (Am_Edit_Translation_Table)in_RDI;
}

Assistant:

Am_Edit_Translation_Table
Am_Edit_Translation_Table::Default_Table()
{
  Am_Edit_Translation_Table table;
  table.Add("RIGHT_ARROW", Am_Move_Cursor_Right);
  table.Add("LEFT_ARROW", Am_Move_Cursor_Left);
  table.Add("CONTROL_f", Am_Move_Cursor_Right);
  table.Add("CONTROL_b", Am_Move_Cursor_Left);
  table.Add("CONTROL_a", Am_Move_Cursor_To_Start);
  table.Add("HOME", Am_Move_Cursor_To_Start);
  table.Add("CONTROL_e", Am_Move_Cursor_To_End);
  table.Add("END", Am_Move_Cursor_To_End);
  table.Add("CONTROL_h", Am_Delete_Char_Before_Cursor);
  table.Add("BACKSPACE", Am_Delete_Char_Before_Cursor);
  table.Add("CONTROL_d", Am_Delete_Char_After_Cursor);
  table.Add("CONTROL_k", Am_Kill_From_Cursor);
  table.Add("CONTROL_u", Am_Delete_Entire_String);
  table.Add("CONTROL_w", Am_Delete_Word_Before_Cursor);
  table.Add("CONTROL_BACKSPACE", Am_Delete_Word_Before_Cursor);
  table.Add("CONTROL_c", Am_Set_Cut_Buffer_From_Text);
  table.Add("MIDDLE_DOWN", Am_Insert_Cut_Buffer_At_Cursor);
#ifdef WIN_KEYBINDINGS
  table.Add("DELETE", Am_Delete_Char_After_Cursor);
  //  table.Add ("CONTROL_DELETE",   Am_Delete_Word_After_Cursor);
  table.Add("CONTROL_v", Am_Insert_Cut_Buffer_At_Cursor);
  table.Add("CONTROL_y", Am_Delete_Entire_String);
#else
  table.Add("DELETE", Am_Delete_Char_Before_Cursor);
  table.Add("CONTROL_DELETE", Am_Delete_Word_After_Cursor);
  table.Add("CONTROL_y", Am_Insert_Cut_Buffer_At_Cursor);
#endif
  return table;
}